

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_face_load_strike_metrics(TT_Face face,FT_ULong strike_index,FT_Size_Metrics *metrics)

{
  FT_Byte FVar1;
  FT_Byte FVar2;
  FT_Byte FVar3;
  FT_Byte *pFVar4;
  FT_Stream stream;
  FT_UShort FVar5;
  FT_Error FVar6;
  FT_Long FVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  FT_Pos FVar11;
  long lVar12;
  long lVar13;
  FT_UShort *pFVar14;
  ulong c_;
  
  if (face->sbit_strike_map == (FT_UInt *)0x0) {
    if (face->sbit_num_strikes <= strike_index) {
      return 6;
    }
  }
  else {
    if ((ulong)(long)(face->root).num_fixed_sizes <= strike_index) {
      return 6;
    }
    strike_index = (FT_ULong)face->sbit_strike_map[strike_index];
  }
  if (1 < face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC) {
    if (face->sbit_table_type != TT_SBIT_TABLE_TYPE_SBIX) {
      return 2;
    }
    uVar8 = *(uint *)(face->sbit_table + strike_index * 4 + 8);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if (face->ebdt_size < (ulong)(uVar8 + 4)) {
      return 3;
    }
    stream = (face->root).stream;
    FVar6 = FT_Stream_Seek(stream,(ulong)uVar8 + face->ebdt_start);
    if (FVar6 != 0) {
      return FVar6;
    }
    FVar6 = FT_Stream_EnterFrame(stream,4);
    if (FVar6 != 0) {
      return FVar6;
    }
    FVar5 = FT_Stream_GetUShort(stream);
    FT_Stream_GetUShort(stream);
    FT_Stream_ExitFrame(stream);
    c_ = (ulong)(face->header).Units_Per_EM;
    metrics->x_ppem = FVar5;
    metrics->y_ppem = FVar5;
    lVar13 = (ulong)FVar5 << 6;
    FVar7 = FT_MulDiv((long)(face->horizontal).Ascender,lVar13,c_);
    metrics->ascender = FVar7;
    FVar7 = FT_MulDiv((long)(face->horizontal).Descender,lVar13,c_);
    metrics->descender = FVar7;
    FVar7 = FT_MulDiv((long)(face->horizontal).Line_Gap +
                      ((long)(face->horizontal).Ascender - (long)(face->horizontal).Descender),
                      lVar13,c_);
    metrics->height = FVar7;
    FVar7 = FT_MulDiv((ulong)(face->horizontal).advance_Width_Max,lVar13,c_);
    metrics->max_advance = FVar7;
    uVar10 = metrics->x_ppem;
    goto LAB_0021e72f;
  }
  pFVar4 = face->sbit_table;
  lVar13 = strike_index * 0x30;
  uVar10 = (ushort)pFVar4[lVar13 + 0x34];
  metrics->x_ppem = uVar10;
  uVar9 = (ushort)pFVar4[lVar13 + 0x35];
  metrics->y_ppem = uVar9;
  FVar1 = pFVar4[lVar13 + 0x18];
  metrics->ascender = (long)(char)FVar1 << 6;
  FVar2 = pFVar4[lVar13 + 0x19];
  lVar12 = (long)(char)FVar2;
  metrics->descender = lVar12 * 0x40;
  FVar3 = pFVar4[lVar13 + 0x21];
  if (lVar12 < 1) {
    if (FVar2 == '\0' && FVar1 == '\0') {
      if (pFVar4[lVar13 + 0x20] == '\0' && FVar3 == '\0') {
        metrics->ascender = (ulong)uVar9 << 6;
        FVar11 = 0;
      }
      else {
        metrics->ascender = (long)(int)(char)pFVar4[lVar13 + 0x20] << 6;
        FVar11 = (long)(int)(char)FVar3 << 6;
      }
      goto LAB_0021e6e3;
    }
  }
  else if ((char)FVar3 < '\0') {
    FVar11 = lVar12 * -0x40;
LAB_0021e6e3:
    metrics->descender = FVar11;
  }
  lVar12 = metrics->ascender - metrics->descender;
  metrics->height = lVar12;
  if (lVar12 == 0) {
    metrics->height = (ulong)uVar9 * 0x40;
    metrics->descender = metrics->ascender + (ulong)uVar9 * -0x40;
  }
  metrics->max_advance =
       ((long)(char)pFVar4[lVar13 + 0x1f] +
       (ulong)pFVar4[lVar13 + 0x1a] + (long)(char)pFVar4[lVar13 + 0x1e]) * 0x40;
LAB_0021e72f:
  pFVar14 = &(face->header).Units_Per_EM;
  FVar7 = FT_MulDiv((ulong)uVar10,0x400000,(ulong)*pFVar14);
  metrics->x_scale = FVar7;
  FVar7 = FT_MulDiv((ulong)metrics->y_ppem,0x400000,(ulong)*pFVar14);
  metrics->y_scale = FVar7;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_strike_metrics( TT_Face           face,
                               FT_ULong          strike_index,
                               FT_Size_Metrics*  metrics )
  {
    /* we have to test for the existence of `sbit_strike_map'    */
    /* because the function gets also used at the very beginning */
    /* to construct `sbit_strike_map' itself                     */
    if ( face->sbit_strike_map )
    {
      if ( strike_index >= (FT_ULong)face->root.num_fixed_sizes )
        return FT_THROW( Invalid_Argument );

      /* map to real index */
      strike_index = face->sbit_strike_map[strike_index];
    }
    else
    {
      if ( strike_index >= (FT_ULong)face->sbit_num_strikes )
        return FT_THROW( Invalid_Argument );
    }

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  strike;
        FT_Char   max_before_bl;
        FT_Char   min_after_bl;


        strike = face->sbit_table + 8 + strike_index * 48;

        metrics->x_ppem = (FT_UShort)strike[44];
        metrics->y_ppem = (FT_UShort)strike[45];

        metrics->ascender  = (FT_Char)strike[16] * 64;  /* hori.ascender  */
        metrics->descender = (FT_Char)strike[17] * 64;  /* hori.descender */

        /* Due to fuzzy wording in the EBLC documentation, we find both */
        /* positive and negative values for `descender'.  Additionally, */
        /* many fonts have both `ascender' and `descender' set to zero  */
        /* (which is definitely wrong).  MS Windows simply ignores all  */
        /* those values...  For these reasons we apply some heuristics  */
        /* to get a reasonable, non-zero value for the height.          */

        max_before_bl = (FT_Char)strike[24];
        min_after_bl  = (FT_Char)strike[25];

        if ( metrics->descender > 0 )
        {
          /* compare sign of descender with `min_after_bl' */
          if ( min_after_bl < 0 )
            metrics->descender = -metrics->descender;
        }

        else if ( metrics->descender == 0 )
        {
          if ( metrics->ascender == 0 )
          {
            FT_TRACE2(( "tt_face_load_strike_metrics:"
                        " sanitizing invalid ascender and descender\n"
                        "                            "
                        " values for strike %d (%dppem, %dppem)\n",
                        strike_index,
                        metrics->x_ppem, metrics->y_ppem ));

            /* sanitize buggy ascender and descender values */
            if ( max_before_bl || min_after_bl )
            {
              metrics->ascender  = max_before_bl * 64;
              metrics->descender = min_after_bl * 64;
            }
            else
            {
              metrics->ascender  = metrics->y_ppem * 64;
              metrics->descender = 0;
            }
          }
        }

#if 0
        else
          ; /* if we have a negative descender, simply use it */
#endif

        metrics->height = metrics->ascender - metrics->descender;
        if ( metrics->height == 0 )
        {
          FT_TRACE2(( "tt_face_load_strike_metrics:"
                      " sanitizing invalid height value\n"
                      "                            "
                      " for strike (%d, %d)\n",
                      metrics->x_ppem, metrics->y_ppem ));
          metrics->height    = metrics->y_ppem * 64;
          metrics->descender = metrics->ascender - metrics->height;
        }

        /* Is this correct? */
        metrics->max_advance = ( (FT_Char)strike[22] + /* min_origin_SB  */
                                          strike[18] + /* max_width      */
                                 (FT_Char)strike[23]   /* min_advance_SB */
                                                     ) * 64;

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_MulDiv( metrics->x_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_MulDiv( metrics->y_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );

        return FT_Err_Ok;
      }

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_Stream       stream = face->root.stream;
        FT_UInt         offset;
        FT_UShort       upem, ppem, resolution;
        TT_HoriHeader  *hori;
        FT_Pos          ppem_; /* to reduce casts */

        FT_Error  error;
        FT_Byte*  p;


        p      = face->sbit_table + 8 + 4 * strike_index;
        offset = FT_NEXT_ULONG( p );

        if ( offset + 4 > face->ebdt_size )
          return FT_THROW( Invalid_File_Format );

        if ( FT_STREAM_SEEK( face->ebdt_start + offset ) ||
             FT_FRAME_ENTER( 4 )                         )
          return error;

        ppem       = FT_GET_USHORT();
        resolution = FT_GET_USHORT();

        FT_UNUSED( resolution ); /* What to do with this? */

        FT_FRAME_EXIT();

        upem = face->header.Units_Per_EM;
        hori = &face->horizontal;

        metrics->x_ppem = ppem;
        metrics->y_ppem = ppem;

        ppem_ = (FT_Pos)ppem;

        metrics->ascender =
          FT_MulDiv( hori->Ascender, ppem_ * 64, upem );
        metrics->descender =
          FT_MulDiv( hori->Descender, ppem_ * 64, upem );
        metrics->height =
          FT_MulDiv( hori->Ascender - hori->Descender + hori->Line_Gap,
                     ppem_ * 64, upem );
        metrics->max_advance =
          FT_MulDiv( hori->advance_Width_Max, ppem_ * 64, upem );

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_MulDiv( metrics->x_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_MulDiv( metrics->y_ppem,
                                      64 * 0x10000,
                                      face->header.Units_Per_EM );

        return error;
      }

    default:
      return FT_THROW( Unknown_File_Format );
    }
  }